

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  Type TVar7;
  CppType CVar8;
  undefined4 extraout_var;
  Descriptor *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FieldDescriptor *this_01;
  undefined4 extraout_var_04;
  FieldDescriptor *this_02;
  Descriptor *pDVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  LogMessage *other;
  string *psVar10;
  string full_type_name;
  string prefix;
  string serialized_value;
  string local_c8;
  string field_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int32 field_number;
  ParseLocation local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Reflection *reflection;
  undefined4 extraout_var_00;
  
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  reflection = (Reflection *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  this_00 = (Descriptor *)CONCAT44(extraout_var_00,iVar6);
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  local_58.line = (this->tokenizer_).current_.line;
  local_58.column = (this->tokenizer_).current_.column;
  bVar3 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&full_type_name,"[",(allocator<char> *)&prefix);
    bVar3 = TryConsume(this,&full_type_name);
    std::__cxx11::string::~string((string *)&full_type_name);
    if (bVar3) {
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      full_type_name._M_string_length = 0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      prefix._M_string_length = 0;
      prefix.field_2._M_local_buf[0] = '\0';
      bVar3 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&serialized_value,"]",(allocator<char> *)&local_c8);
        bVar3 = Consume(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (!bVar3) goto LAB_0032e8e9;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&serialized_value,":",(allocator<char> *)&local_c8);
        TryConsume(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        serialized_value._M_dataplus._M_p = (pointer)&serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
        bVar3 = ConsumeAnyValue(this,&full_type_name,
                                *(DescriptorPool **)
                                 (*(long *)(CONCAT44(extraout_var_01,iVar6) + 0x10) + 0x10),
                                &serialized_value);
        if (bVar3) {
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(any_type_url_field + 0x4c) != 3 &&
               (iVar6 = (*reflection->_vptr_Reflection[5])(reflection,message), (char)iVar6 != '\0')
               ) || ((*(int *)(any_value_field + 0x4c) != 3 &&
                     (iVar6 = (*reflection->_vptr_Reflection[5])(reflection,message),
                     (char)iVar6 != '\0')))))) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c8,"Non-repeated Any specified multiple times.",
                       (allocator<char> *)&field_number);
            ReportError(this,&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            goto LAB_0032e7cf;
          }
          std::operator+(&local_c8,&prefix,&full_type_name);
          (*reflection->_vptr_Reflection[0x24])(reflection,message,any_type_url_field,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          bVar3 = true;
          (*reflection->_vptr_Reflection[0x24])
                    (reflection,message,any_value_field,&serialized_value);
        }
        else {
LAB_0032e7cf:
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)&serialized_value);
      }
      else {
LAB_0032e8e9:
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&full_type_name);
      goto LAB_0032f25c;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_type_name,"[",(allocator<char> *)&prefix);
  bVar3 = TryConsume(this,&full_type_name);
  std::__cxx11::string::~string((string *)&full_type_name);
  if (bVar3) {
    bVar3 = ConsumeFullTypeName(this,&field_name);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&full_type_name,"]",(allocator<char> *)&prefix);
      bVar3 = Consume(this,&full_type_name);
      std::__cxx11::string::~string((string *)&full_type_name);
      if (bVar3) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar6 = (*reflection->_vptr_Reflection[0x4d])(reflection,&field_name);
          this_02 = (FieldDescriptor *)CONCAT44(extraout_var_04,iVar6);
        }
        else {
          iVar6 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,&field_name);
          this_02 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar6);
        }
        if (this_02 != (FieldDescriptor *)0x0) goto LAB_0032eb18;
        if (this->allow_unknown_field_ == false) {
          std::operator+(&local_c8,"Extension \"",&field_name);
          std::operator+(&serialized_value,&local_c8,
                         "\" is not defined or is not an extension of \"");
          std::operator+(&prefix,&serialized_value,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (this_00 + 8));
          std::operator+(&full_type_name,&prefix,"\".");
          ReportError(this,&full_type_name);
          goto LAB_0032f22f;
        }
        std::operator+(&local_c8,"Extension \"",&field_name);
        std::operator+(&serialized_value,&local_c8,"\" is not defined or is not an extension of \"")
        ;
        std::operator+(&prefix,&serialized_value,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_00 + 8));
        std::operator+(&full_type_name,&prefix,"\".");
        ReportWarning(this,&full_type_name);
LAB_0032ef66:
        std::__cxx11::string::~string((string *)&full_type_name);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&local_c8);
        if (this->allow_unknown_field_ == false) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&full_type_name,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                     ,0x1d9);
          other = internal::LogMessage::operator<<
                            ((LogMessage *)&full_type_name,"CHECK failed: allow_unknown_field_: ");
          internal::LogFinisher::operator=((LogFinisher *)&prefix,other);
          internal::LogMessage::~LogMessage((LogMessage *)&full_type_name);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&full_type_name,":",(allocator<char> *)&local_c8);
        bVar3 = TryConsume(this,&full_type_name);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&prefix,"{",(allocator<char> *)&field_number);
          psVar10 = &(this->tokenizer_).current_.text;
          _Var5 = std::operator==(psVar10,&prefix);
          if (_Var5) {
            std::__cxx11::string::~string((string *)&prefix);
            goto LAB_0032f041;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&serialized_value,"<",(allocator<char> *)&local_50);
          _Var5 = std::operator==(psVar10,&serialized_value);
          std::__cxx11::string::~string((string *)&serialized_value);
          std::__cxx11::string::~string((string *)&prefix);
          std::__cxx11::string::~string((string *)&full_type_name);
          if (!_Var5) {
            bVar3 = SkipFieldValue(this);
            goto LAB_0032f25c;
          }
        }
        else {
LAB_0032f041:
          std::__cxx11::string::~string((string *)&full_type_name);
        }
        bVar3 = SkipFieldMessage(this);
        goto LAB_0032f25c;
      }
    }
  }
  else {
    bVar3 = ConsumeIdentifier(this,&field_name);
    if (!bVar3) goto LAB_0032f25a;
    if ((this->allow_field_number_ == true) &&
       (bVar3 = safe_strto32(&field_name,&field_number), bVar3)) {
      bVar3 = Descriptor::IsExtensionNumber(this_00,field_number);
      if (bVar3) {
        iVar6 = (*reflection->_vptr_Reflection[0x4e])();
        this_02 = (FieldDescriptor *)CONCAT44(extraout_var_03,iVar6);
      }
      else {
        this_02 = Descriptor::FindFieldByNumber(this_00,field_number);
      }
LAB_0032eb0f:
      if (this_02 != (FieldDescriptor *)0x0) goto LAB_0032eb18;
LAB_0032eeee:
      if (this->allow_unknown_field_ != false) {
        std::operator+(&local_c8,"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_00 + 8));
        std::operator+(&serialized_value,&local_c8,"\" has no field named \"");
        std::operator+(&prefix,&serialized_value,&field_name);
        std::operator+(&full_type_name,&prefix,"\".");
        ReportWarning(this,&full_type_name);
        goto LAB_0032ef66;
      }
      std::operator+(&local_c8,"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (this_00 + 8));
      std::operator+(&serialized_value,&local_c8,"\" has no field named \"");
      std::operator+(&prefix,&serialized_value,&field_name);
      std::operator+(&full_type_name,&prefix,"\".");
      ReportError(this,&full_type_name);
LAB_0032f22f:
      std::__cxx11::string::~string((string *)&full_type_name);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&serialized_value);
      psVar10 = &local_c8;
    }
    else {
      this_02 = Descriptor::FindFieldByName(this_00,&field_name);
      if (this_02 == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string((string *)&full_type_name,(string *)&field_name);
        LowerString(&full_type_name);
        this_01 = Descriptor::FindFieldByName(this_00,&full_type_name);
        if (this_01 == (FieldDescriptor *)0x0) {
          this_02 = (FieldDescriptor *)0x0;
        }
        else {
          TVar7 = FieldDescriptor::type(this_01);
          this_02 = (FieldDescriptor *)0x0;
          if (TVar7 == TYPE_GROUP) {
            this_02 = this_01;
          }
        }
        std::__cxx11::string::~string((string *)&full_type_name);
        if (this_02 != (FieldDescriptor *)0x0) goto LAB_0032eaa2;
LAB_0032eacb:
        if (this->allow_case_insensitive_field_ == true) {
          std::__cxx11::string::string((string *)&full_type_name,(string *)&field_name);
          LowerString(&full_type_name);
          this_02 = Descriptor::FindFieldByLowercaseName(this_00,&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
          goto LAB_0032eb0f;
        }
        goto LAB_0032eeee;
      }
LAB_0032eaa2:
      TVar7 = FieldDescriptor::type(this_02);
      if (TVar7 == TYPE_GROUP) {
        pDVar9 = FieldDescriptor::message_type(this_02);
        bVar3 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)pDVar9,&field_name);
        if (bVar3) goto LAB_0032eacb;
      }
LAB_0032eb18:
      if (this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) {
LAB_0032ecac:
        CVar8 = FieldDescriptor::cpp_type(this_02);
        if (CVar8 == CPPTYPE_MESSAGE) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&full_type_name,":",(allocator<char> *)&prefix);
          bVar3 = TryConsume(this,&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
          if (((!bVar3) || (*(char *)(*(long *)(this_02 + 0x80) + 0x6f) != '\x01')) ||
             ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_0032ed9f;
          full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
          full_type_name._M_string_length = 0;
          full_type_name.field_2._M_local_buf[0] = '\0';
          bVar3 = ConsumeString(this,&full_type_name);
          if (!bVar3) {
            psVar10 = &full_type_name;
            goto LAB_0032f255;
          }
          iVar6 = (*reflection->_vptr_Reflection[0x27])(reflection,message,this_02,0);
          MessageLite::ParseFromString
                    ((MessageLite *)CONCAT44(extraout_var_06,iVar6),&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&full_type_name,":",(allocator<char> *)&prefix);
          bVar3 = Consume(this,&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
          if (!bVar3) goto LAB_0032f25a;
LAB_0032ed9f:
          if (*(int *)(this_02 + 0x4c) == 3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&full_type_name,"[",(allocator<char> *)&prefix);
            bVar3 = TryConsume(this,&full_type_name);
            std::__cxx11::string::~string((string *)&full_type_name);
            if (bVar3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&full_type_name,"]",(allocator<char> *)&prefix);
              bVar3 = TryConsume(this,&full_type_name);
              std::__cxx11::string::~string((string *)&full_type_name);
              if (!bVar3) {
                do {
                  CVar8 = FieldDescriptor::cpp_type(this_02);
                  if (CVar8 == CPPTYPE_MESSAGE) {
                    bVar3 = ConsumeFieldMessage(this,message,reflection,this_02);
                  }
                  else {
                    bVar3 = ConsumeFieldValue(this,message,reflection,this_02);
                  }
                  if (bVar3 == false) goto LAB_0032f25a;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&full_type_name,"]",(allocator<char> *)&prefix);
                  bVar3 = TryConsume(this,&full_type_name);
                  std::__cxx11::string::~string((string *)&full_type_name);
                  if (bVar3) goto LAB_0032f074;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&full_type_name,",",(allocator<char> *)&prefix);
                  bVar4 = Consume(this,&full_type_name);
                  std::__cxx11::string::~string((string *)&full_type_name);
                  bVar3 = false;
                } while (bVar4);
                goto LAB_0032f25c;
              }
              goto LAB_0032f074;
            }
          }
          CVar8 = FieldDescriptor::cpp_type(this_02);
          if (CVar8 == CPPTYPE_MESSAGE) {
            bVar3 = ConsumeFieldMessage(this,message,reflection,this_02);
          }
          else {
            bVar3 = ConsumeFieldValue(this,message,reflection,this_02);
          }
          if (bVar3 == false) goto LAB_0032f25a;
        }
LAB_0032f074:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&full_type_name,";",(allocator<char> *)&serialized_value);
        bVar3 = TryConsume(this,&full_type_name);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&prefix,",",(allocator<char> *)&local_c8);
          TryConsume(this,&prefix);
          std::__cxx11::string::~string((string *)&prefix);
        }
        std::__cxx11::string::~string((string *)&full_type_name);
        if (*(char *)(*(long *)(this_02 + 0x80) + 0x6e) == '\x01') {
          std::operator+(&prefix,"text format contains deprecated field \"",&field_name);
          std::operator+(&full_type_name,&prefix,"\"");
          ReportWarning(this,&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
          std::__cxx11::string::~string((string *)&prefix);
        }
        bVar3 = true;
        if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
          ParseInfoTree::RecordLocation(this->parse_info_tree_,this_02,local_58);
        }
        goto LAB_0032f25c;
      }
      if ((*(int *)(this_02 + 0x4c) == 3) ||
         (iVar6 = (*reflection->_vptr_Reflection[5])(reflection,message,this_02),
         (char)iVar6 == '\0')) {
        puVar2 = *(undefined8 **)(this_02 + 0x60);
        if ((puVar2 == (undefined8 *)0x0) ||
           (iVar6 = (*reflection->_vptr_Reflection[8])(reflection,message,puVar2),
           (char)iVar6 == '\0')) goto LAB_0032ecac;
        iVar6 = (*reflection->_vptr_Reflection[10])(reflection,message,puVar2);
        std::operator+(&local_50,"Field \"",&field_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_number,&local_50,"\" is specified along with field \"");
        std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_number,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        CONCAT44(extraout_var_05,iVar6));
        std::operator+(&serialized_value,&local_c8,"\", another member of oneof \"");
        std::operator+(&prefix,&serialized_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar2)
        ;
        std::operator+(&full_type_name,&prefix,"\".");
        ReportError(this,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&field_number);
        psVar10 = &local_50;
      }
      else {
        std::operator+(&prefix,"Non-repeated field \"",&field_name);
        std::operator+(&full_type_name,&prefix,"\" is specified multiple times.");
        ReportError(this,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
        psVar10 = &prefix;
      }
    }
LAB_0032f255:
    std::__cxx11::string::~string((string *)psVar10);
  }
LAB_0032f25a:
  bVar3 = false;
LAB_0032f25c:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar3;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      string serialized_value;
      DO(ConsumeAnyValue(full_type_name,
                         message->GetDescriptor()->file()->pool(),
                         &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(
          message, any_type_url_field,
          string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == NULL) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
            field = NULL;
          }
        }
        // Again, special-case group names as described above.
        if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
            && field->message_type()->name() != field_name) {
          field = NULL;
        }

        if (field == NULL && allow_case_insensitive_field_) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != NULL && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name + "\" is specified along with "
                    "field \"" + other_field->name() + "\", another member "
                    "of oneof \"" + oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() && LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        string tmp;
        DO(ConsumeString(&tmp));
        reflection->MutableMessage(message, field)->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }